

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.cpp
# Opt level: O3

void __thiscall
Contact::Contact(Contact *this,string *name,
                unique_ptr<Address,_std::default_delete<Address>_> *address)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  Address *pAVar4;
  long lVar5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  Address *pAVar8;
  
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar7 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar7;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  pAVar4 = (address->_M_t).super___uniq_ptr_impl<Address,_std::default_delete<Address>_>._M_t.
           super__Tuple_impl<0UL,_Address_*,_std::default_delete<Address>_>.
           super__Head_base<0UL,_Address_*,_false>._M_head_impl;
  if (pAVar4 == (Address *)0x0) {
    pAVar8 = (Address *)0x0;
  }
  else {
    pAVar8 = (Address *)operator_new(0x48);
    (pAVar8->street_address)._M_dataplus._M_p = (pointer)&(pAVar8->street_address).field_2;
    lVar5 = *(long *)&(pAVar4->street_address)._M_dataplus;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pAVar8,lVar5,(pAVar4->street_address)._M_string_length + lVar5);
    (pAVar8->city)._M_dataplus._M_p = (pointer)&(pAVar8->city).field_2;
    _Var6._M_p = (pAVar4->city)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pAVar8->city,_Var6._M_p,_Var6._M_p + (pAVar4->city)._M_string_length);
    pAVar8->suite = pAVar4->suite;
  }
  (this->work_address)._M_t.super___uniq_ptr_impl<Address,_std::default_delete<Address>_>._M_t.
  super__Tuple_impl<0UL,_Address_*,_std::default_delete<Address>_>.
  super__Head_base<0UL,_Address_*,_false>._M_head_impl = pAVar8;
  return;
}

Assistant:

explicit Contact(std::string name, std::unique_ptr<Address> address)
		:	name{std::move(name)},
			work_address{address ? std::make_unique<Address>(*address) : nullptr}
	{}